

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

Matrix_Sparse *
Disa::operator+(Matrix_Sparse *__return_storage_ptr__,Matrix_Sparse *matrix_0,
               Matrix_Sparse *matrix_1)

{
  pointer puVar1;
  pointer puVar2;
  ostream *poVar3;
  source_location *in_RCX;
  unsigned_long uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVar5 = Matrix_Sparse::size(matrix_0);
  pVar6 = Matrix_Sparse::size(matrix_1);
  if (pVar5 != pVar6) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_50 = &PTR_s__workspace_llm4binary_github_lic_0017b218;
    console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,in_RCX);
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    puVar1 = (matrix_0->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix_0->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    if (puVar1 != puVar2) {
      uVar4 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_170,uVar4);
    std::operator+(&local_150,"Incompatible matrix dimensions, ",&local_170);
    std::operator+(&local_130,&local_150,",");
    std::__cxx11::to_string(&local_190,matrix_0->column_size);
    std::operator+(&local_110,&local_130,&local_190);
    std::operator+(&local_f0,&local_110," vs. ");
    puVar1 = (matrix_1->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (matrix_1->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    if (puVar1 != puVar2) {
      uVar4 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
    }
    std::__cxx11::to_string(&local_1b0,uVar4);
    std::operator+(&local_d0,&local_f0,&local_1b0);
    std::operator+(&local_b0,&local_d0,",");
    std::__cxx11::to_string(&local_1d0,matrix_1->column_size);
    std::operator+(&local_90,&local_b0,&local_1d0);
    std::operator+(&local_70,&local_90,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_48);
    exit(1);
  }
  Matrix_Sparse::matrix_arithmetic<true>(matrix_0,matrix_1);
  Matrix_Sparse::Matrix_Sparse(__return_storage_ptr__,matrix_0);
  return __return_storage_ptr__;
}

Assistant:

inline Matrix_Sparse operator+(Matrix_Sparse matrix_0, const Matrix_Sparse& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  matrix_0 += matrix_1;
  return matrix_0;
}